

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O0

bool __thiscall soinn::ESOINN::needMergeClasses(ESOINN *this,Vertex *a,Vertex *b)

{
  int iVar1;
  vertex_bundled *pvVar2;
  vertex_bundled *pvVar3;
  double *pdVar4;
  double dVar5;
  double max;
  double dVar6;
  double max_00;
  double minAB;
  double thresholdB;
  double maxB;
  double meanB;
  int B;
  double thresholdA;
  double maxA;
  double meanA;
  int A;
  Vertex *b_local;
  Vertex *a_local;
  ESOINN *this_local;
  
  pvVar2 = boost::
           adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
           ::operator[](&this->graph,*a);
  iVar1 = pvVar2->classId;
  dVar5 = meanDensity(this,iVar1);
  max = maxDensity(this,iVar1);
  dVar5 = densityThershold(this,dVar5,max);
  pvVar2 = boost::
           adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
           ::operator[](&this->graph,*b);
  iVar1 = pvVar2->classId;
  dVar6 = meanDensity(this,iVar1);
  max_00 = maxDensity(this,iVar1);
  dVar6 = densityThershold(this,dVar6,max_00);
  pvVar2 = boost::
           adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
           ::operator[](&this->graph,*a);
  pvVar3 = boost::
           adjacency_list<boost::listS,_boost::listS,_boost::undirectedS,_boost::property<boost::vertex_index_t,_unsigned_long,_soinn::VertexProperties>,_soinn::EdgeProperties,_boost::no_property,_boost::listS>
           ::operator[](&this->graph,*b);
  pdVar4 = std::min<double>(&pvVar2->density,&pvVar3->density);
  if ((*pdVar4 <= dVar5 * max) || (*pdVar4 <= dVar6 * max_00)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ESOINN::needMergeClasses(Vertex &a, Vertex &b)
{
    int A = graph[a].classId;
    double meanA = meanDensity(A);
    double maxA = maxDensity(A);
    double thresholdA = densityThershold(meanA, maxA);
    int B = graph[b].classId;
    double meanB = meanDensity(B);
    double maxB = maxDensity(B);
    double thresholdB = densityThershold(meanB, maxB);
    double minAB = std::min(graph[a].density, graph[b].density);
    if(minAB > thresholdA * maxA && minAB > thresholdB * maxB)
    {
        return true;
    }
    return false;
}